

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O2

void __thiscall state_t::state_t(state_t *this,state_t *param_1)

{
  pointer pvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  pvVar1 = (param_1->image).
           super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->image).
       super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (this->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->image).
       super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->image).
  super__Vector_base<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->available)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->available)._M_t._M_impl.super__Rb_tree_header);
  sVar2 = param_1->row;
  sVar3 = param_1->col;
  sVar4 = param_1->h;
  this->w = param_1->w;
  this->h = sVar4;
  this->row = sVar2;
  this->col = sVar3;
  return;
}

Assistant:

state_t(size_t width, size_t height, const tiles_t& tiles)
      : w{width}, h{height}, image(height, image_t::value_type(width))
  {
    for (const auto& t : tiles) {
      available.insert(t.first);
    }
  }